

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePiece.cc
# Opt level: O0

void __thiscall
onmt::SentencePiece::SentencePiece
          (SentencePiece *this,string *model_path,int nbest_size,float alpha)

{
  undefined4 in_EDX;
  SentencePieceProcessor *in_RDI;
  undefined4 in_XMM0_Da;
  string *in_stack_00000018;
  SentencePieceProcessor *in_stack_00000020;
  pointer in_stack_ffffffffffffffb8;
  
  SubwordEncoder::SubwordEncoder((SubwordEncoder *)in_RDI);
  in_RDI->_vptr_SentencePieceProcessor = (_func_int **)&PTR__SentencePiece_006efb98;
  operator_new(0x58);
  sentencepiece::SentencePieceProcessor::SentencePieceProcessor(in_RDI);
  std::
  unique_ptr<sentencepiece::SentencePieceProcessor,std::default_delete<sentencepiece::SentencePieceProcessor>>
  ::unique_ptr<std::default_delete<sentencepiece::SentencePieceProcessor>,void>
            ((unique_ptr<sentencepiece::SentencePieceProcessor,_std::default_delete<sentencepiece::SentencePieceProcessor>_>
              *)in_RDI,in_stack_ffffffffffffffb8);
  *(undefined4 *)
   &(in_RDI->normalizer_)._M_t.
    super___uniq_ptr_impl<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::normalizer::Normalizer_*,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
    .super__Head_base<0UL,_sentencepiece::normalizer::Normalizer_*,_false>._M_head_impl = in_EDX;
  *(undefined4 *)
   ((long)&(in_RDI->normalizer_)._M_t.
           super___uniq_ptr_impl<sentencepiece::normalizer::Normalizer,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
           ._M_t.
           super__Tuple_impl<0UL,_sentencepiece::normalizer::Normalizer_*,_std::default_delete<sentencepiece::normalizer::Normalizer>_>
           .super__Head_base<0UL,_sentencepiece::normalizer::Normalizer_*,_false>._M_head_impl + 4)
       = in_XMM0_Da;
  std::
  unique_ptr<sentencepiece::SentencePieceProcessor,_std::default_delete<sentencepiece::SentencePieceProcessor>_>
  ::operator*((unique_ptr<sentencepiece::SentencePieceProcessor,_std::default_delete<sentencepiece::SentencePieceProcessor>_>
               *)in_RDI);
  load_model(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

SentencePiece::SentencePiece(const std::string& model_path, int nbest_size, float alpha)
    : _processor(new sentencepiece::SentencePieceProcessor())
    , _nbest_size(nbest_size)
    , _alpha(alpha)
  {
    load_model(*_processor, model_path);
  }